

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlFlowGraphBuilder.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
* buildLabelMap_abi_cxx11_
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *__return_storage_ptr__,AssemblyCommands *commands)

{
  mapped_type mVar1;
  ulong uVar2;
  size_type sVar3;
  __shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar4;
  mapped_type *pmVar5;
  long local_80;
  LabelCommand local_48;
  LabelCommand *labelCommand;
  int i;
  AssemblyCommands *commands_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *map;
  
  labelCommand._7_1_ = 0;
  _i = commands;
  commands_local = (AssemblyCommands *)__return_storage_ptr__;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(__return_storage_ptr__);
  for (labelCommand._0_4_ = 0; uVar2 = (ulong)(int)labelCommand,
      sVar3 = std::
              vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
              ::size(_i), uVar2 < sVar3; labelCommand._0_4_ = (int)labelCommand + 1) {
    this = &std::
            vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
            ::operator[](_i,(long)(int)labelCommand)->
            super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>;
    peVar4 = std::__shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>::get(this)
    ;
    if (peVar4 == (element_type *)0x0) {
      local_80 = 0;
    }
    else {
      local_80 = __dynamic_cast(peVar4,&AssemblyCode::AssemblyCommand::typeinfo,
                                &AssemblyCode::LabelCommand::typeinfo,0);
    }
    mVar1 = (int)labelCommand;
    local_48._32_8_ = local_80;
    if (local_80 != 0) {
      AssemblyCode::LabelCommand::getLabel_abi_cxx11_(&local_48);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)&local_48);
      *pmVar5 = mVar1;
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, int> buildLabelMap(const AssemblyCommands &commands) {
    std::map<std::string, int> map;
    for (int i = 0; i < commands.size(); ++i) {
        const AssemblyCode::LabelCommand* labelCommand =
                dynamic_cast<const AssemblyCode::LabelCommand*>(commands[i].get());

        if (labelCommand != nullptr) {
            map[labelCommand->getLabel()] = i;
        }
    }

    return map;
}